

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

Ref __thiscall cashew::ValueBuilder::makeCall(ValueBuilder *this,IString target)

{
  Value *pVVar1;
  Ref RVar2;
  char *extraout_RDX;
  IString name;
  Ref local_28;
  ValueBuilder *local_20;
  IString target_local;
  Ref ret;
  
  target_local.str._M_len = target.str._M_len;
  local_20 = this;
  local_28 = makeRawArray(3);
  pVVar1 = Ref::operator->(&local_28);
  RVar2 = makeRawString((IString *)&CALL);
  pVVar1 = Value::push_back(pVVar1,RVar2);
  name.str._M_str = extraout_RDX;
  name.str._M_len = target_local.str._M_len;
  RVar2 = makeName(local_20,name);
  pVVar1 = Value::push_back(pVVar1,RVar2);
  RVar2 = makeRawArray(0);
  pVVar1 = Value::push_back(pVVar1,RVar2);
  Ref::Ref((Ref *)&target_local.str._M_str,pVVar1);
  return (Ref)(Value *)target_local.str._M_str;
}

Assistant:

static Ref makeCall(IString target) {
    Ref ret = &makeRawArray(3)
                 ->push_back(makeRawString(CALL))
                 .push_back(makeName(target))
                 .push_back(makeRawArray());
    return ret;
  }